

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall
kj::anon_unknown_36::HttpOutputStream::queueWrite(HttpOutputStream *this,String *content)

{
  Promise<void> *dependencyParam;
  PromiseArena *pPVar1;
  PromiseArena *pPVar2;
  PromiseNode *pPVar3;
  PromiseArena *pPVar4;
  PromiseArenaMember *node;
  OwnPromiseNode node_00;
  void *pvVar5;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode intermediate;
  HttpOutputStream *pHVar6;
  long lVar7;
  _func_int **pp_Var8;
  undefined8 uVar9;
  OwnPromiseNode local_58;
  PromiseNode *local_50;
  undefined1 local_48 [24];
  
  dependencyParam = &this->writeQueue;
  pPVar1 = (PromiseArena *)(content->content).ptr;
  pp_Var8 = (_func_int **)(content->content).size_;
  pPVar2 = (PromiseArena *)(content->content).disposer;
  (content->content).ptr = (char *)0x0;
  (content->content).size_ = 0;
  pPVar3 = (this->writeQueue).super_PromiseBase.node.ptr;
  pPVar4 = (pPVar3->super_PromiseArenaMember).arena;
  pHVar6 = this;
  if (pPVar4 == (PromiseArena *)0x0 || (ulong)((long)pPVar3 - (long)pPVar4) < 0x40) {
    pvVar5 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar5 + 0x3c0);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)dependencyParam,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:2386:34)>
               ::anon_class_32_2_06e25726_for_func::operator());
    *(undefined ***)((long)pvVar5 + 0x3c0) = &PTR_destroy_0063e948;
    *(HttpOutputStream **)((long)pvVar5 + 0x3e0) = this;
    *(PromiseArena **)((long)pvVar5 + 1000) = pPVar1;
    *(_func_int ***)((long)pvVar5 + 0x3f0) = pp_Var8;
    *(PromiseArena **)((long)pvVar5 + 0x3f8) = pPVar2;
    *(void **)((long)pvVar5 + 0x3c8) = pvVar5;
  }
  else {
    (pPVar3->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    this_00 = (TransformPromiseNodeBase *)(pPVar3 + -4);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)dependencyParam,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:2386:34)>
               ::anon_class_32_2_06e25726_for_func::operator());
    pPVar3[-4].super_PromiseArenaMember._vptr_PromiseArenaMember =
         (_func_int **)&PTR_destroy_0063e948;
    pPVar3[-2].super_PromiseArenaMember._vptr_PromiseArenaMember = (_func_int **)this;
    pPVar3[-2].super_PromiseArenaMember.arena = pPVar1;
    pPVar3[-1].super_PromiseArenaMember._vptr_PromiseArenaMember = pp_Var8;
    pPVar3[-1].super_PromiseArenaMember.arena = pPVar2;
    pPVar3[-4].super_PromiseArenaMember.arena = pPVar4;
  }
  uVar9 = 0;
  lVar7 = 0;
  local_48._0_8_ = &DAT_004a8171;
  local_48._8_8_ = &DAT_004a81d0;
  local_48._16_8_ = &DAT_4c0000058b;
  local_58.ptr = &this_00->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_50,&local_58,(SourceLocation *)local_48);
  node_00.ptr = local_58.ptr;
  if ((TransformPromiseNodeBase *)local_58.ptr != (TransformPromiseNodeBase *)0x0) {
    local_58.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node_00.ptr)->super_PromiseArenaMember);
  }
  node = &((dependencyParam->super_PromiseBase).node.ptr)->super_PromiseArenaMember;
  (dependencyParam->super_PromiseBase).node.ptr = local_50;
  if (node != (PromiseArenaMember *)0x0) {
    kj::_::PromiseDisposer::dispose(node);
  }
  if (lVar7 != 0) {
    (***(_func_int ***)pPVar2->bytes)(pPVar2,lVar7,1,uVar9,uVar9,0,pHVar6,0,0);
  }
  return;
}

Assistant:

void queueWrite(kj::String content) {
    // We only use queueWrite() in cases where we can take ownership of the write buffer, and where
    // it is convenient if we can return `void` rather than a promise.  In particular, this is used
    // to write headers and chunk boundaries. Writes of application data do not go into
    // `writeQueue` because this would prevent cancellation. Instead, they wait until `writeQueue`
    // is empty, then they make the write directly, using `writeInProgress` to detect and block
    // concurrent writes.

    writeQueue = writeQueue.then([this,content=kj::mv(content)]() mutable {
      auto promise = inner.write(content.asBytes());
      return promise.attach(kj::mv(content));
    });
  }